

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  TPZGeoNode *this_00;
  long *plVar3;
  TPZConnect *this_01;
  uint *puVar4;
  pair<int,_long> *this_02;
  long in_RSI;
  long *in_RDI;
  int ish;
  int nvec_shape;
  TPZShapeData *shapedata;
  int i_2;
  int i_1;
  int i;
  TPZGeoEl *gel;
  TPZManVector<int,_2> sideorient;
  TPZManVector<int,_3> orders;
  TPZManVector<long,_2> ids;
  undefined8 in_stack_fffffffffffffe98;
  TPZShapeData *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  int64_t in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  TPZManVector<std::pair<int,_long>,_20> *in_stack_ffffffffffffff10;
  TPZFMatrix<double> *in_stack_ffffffffffffff18;
  int local_e0;
  int local_dc;
  long local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  TPZGeoEl *local_c0;
  undefined4 local_b4;
  TPZVec<int> local_b0;
  undefined4 local_74;
  TPZShapeData *in_stack_ffffffffffffff98;
  TPZVec<int> *in_stack_ffffffffffffffa0;
  TPZVec<int> *in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb0;
  TPZVec<long> local_40;
  long local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_2>::TPZManVector
            ((TPZManVector<long,_2> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (int64_t)in_stack_fffffffffffffeb8);
  local_74 = 0;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_b4 = 0;
  TPZManVector<int,_2>::TPZManVector
            ((TPZManVector<int,_2> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_c0 = TPZCompEl::Reference
                       ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffeac);
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](&local_40,(long)local_c4);
    *plVar3 = (long)iVar2;
  }
  for (local_c8 = 0; local_c8 < 3; local_c8 = local_c8 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_c8);
    bVar1 = TPZConnect::Order(this_01);
    in_stack_fffffffffffffec4 = (uint)bVar1;
    puVar4 = (uint *)TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff90,(long)local_c8)
    ;
    *puVar4 = in_stack_fffffffffffffec4;
  }
  for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
    in_stack_fffffffffffffec0 =
         SideOrient((TPZCompElHDiv<pzshape::TPZShapeLinear> *)in_stack_fffffffffffffea0,
                    (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    in_stack_fffffffffffffeb8 = TPZVec<int>::operator[](&local_b0,(long)local_cc);
    *in_stack_fffffffffffffeb8 = in_stack_fffffffffffffec0;
  }
  local_d8 = local_10;
  local_dc = 0;
  iVar2 = (int)in_RDI[0x18];
  if (iVar2 == 0) {
    TPZShapeHDiv<pzshape::TPZShapeLinear>::Initialize
              ((TPZVec<long> *)orders._40_8_,(TPZVec<int> *)orders.fExtAlloc._0_8_,
               (TPZVec<int> *)orders.super_TPZVec<int>.fNAlloc,
               (TPZShapeData *)orders.super_TPZVec<int>.fNElements);
    in_stack_fffffffffffffeb0 =
         TPZShapeHDiv<pzshape::TPZShapeLinear>::NShapeF(in_stack_fffffffffffffea0);
    local_dc = in_stack_fffffffffffffeb0;
  }
  else if (iVar2 == 1) {
    TPZShapeHDivConstant<pzshape::TPZShapeLinear>::Initialize
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    local_dc = (**(code **)(*in_RDI + 600))();
  }
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffff18,(int64_t)in_stack_ffffffffffffff10,(int64_t)in_RDI);
  TPZManVector<std::pair<int,_long>,_20>::Resize(in_stack_ffffffffffffff10,(int64_t)in_RDI);
  for (local_e0 = 0; local_e0 < local_dc; local_e0 = local_e0 + 1) {
    in_stack_fffffffffffffea0 =
         (TPZShapeData *)
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    (int64_t)in_stack_fffffffffffffeb8,CONCAT44(iVar2,in_stack_fffffffffffffeb0));
    *(double *)in_stack_fffffffffffffea0 = 1.0;
    std::pair<int,_long>::pair<int_&,_int_&,_true>
              ((pair<int,_long> *)&stack0xffffffffffffff10,&local_e0,&local_e0);
    this_02 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_e0);
    std::pair<int,_long>::operator=(this_02,(type)&stack0xffffffffffffff10);
  }
  *(undefined4 *)(local_10 + 8) = 3;
  TPZManVector<int,_2>::~TPZManVector((TPZManVector<int,_2> *)in_stack_fffffffffffffea0);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffffea0);
  TPZManVector<long,_2>::~TPZManVector((TPZManVector<long,_2> *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}